

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnThrowRefExpr(BinaryReaderInterp *this)

{
  Result RVar1;
  Location loc;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnThrowRef(&this->validator_,&loc);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,ThrowRef);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnThrowRefExpr() {
  CHECK_RESULT(validator_.OnThrowRef(GetLocation()));
  istream_.Emit(Opcode::ThrowRef);
  return Result::Ok;
}